

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_extract.hpp
# Opt level: O2

string * file_io::extract_content(string *__return_storage_ptr__,string *__file_path)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  istream *piVar6;
  undefined8 extraout_RAX;
  byte bVar7;
  string _line;
  regex _whitespace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  ifstream _input_file;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&_input_file,(string *)__file_path,_S_in);
  poVar5 = std::operator<<((ostream *)&std::cout,"Extracting content from: ");
  poVar5 = std::operator<<(poVar5,(string *)__file_path);
  std::endl<char,std::char_traits<char>>(poVar5);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::operator+(&local_2b8,"Cannot open file at: ",__file_path);
    exit_error_code(3,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::ifstream::~ifstream(&_input_file);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&_whitespace,"\\s+",0x10);
  _line._M_dataplus._M_p = (pointer)&_line.field_2;
  _line._M_string_length = 0;
  _line.field_2._M_local_buf[0] = '\0';
  bVar7 = 0;
  bVar1 = false;
  bVar4 = false;
LAB_00107957:
  while( true ) {
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&_input_file,(string *)&_line);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&_line);
        std::ifstream::close();
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  (&_whitespace);
        std::ifstream::~ifstream(&_input_file);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string((string *)&local_258,(string *)&_line);
      bVar3 = is_frontmatter_tag(&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      if ((~bVar3 & 1U) != 0 || bVar7 != 0) break;
      bVar7 = 1;
    }
    std::__cxx11::string::string((string *)&local_278,(string *)&_line);
    bVar3 = is_frontmatter_tag(&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    if ((bVar3 & bVar7) != 1) goto LAB_001079d1;
    if (bVar1) break;
    bVar7 = 1;
    bVar1 = true;
  }
  goto LAB_001079d7;
LAB_001079d1:
  if (bVar7 != 1 || bVar1) {
LAB_001079d7:
    bVar3 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&_line,&_whitespace,0);
    if ((~bVar3 & _line._M_string_length != 0) != 0 || bVar4) {
      std::operator+(&local_298,&_line,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_298);
      bVar4 = true;
    }
  }
  goto LAB_00107957;
}

Assistant:

std::string extract_content(std::string __file_path) {
        std::string _output;
        std::ifstream _input_file(__file_path);
        std::cout << "Extracting content from: " << __file_path << std::endl;
        if (!_input_file.is_open())
            exit_error_code(3, "Cannot open file at: " + __file_path);		

        std::regex _whitespace("\\s+");
        bool _is_opening_tag_parse = false, _is_closing_tag_parse = false, _content_start = false;
        for (std::string _line; std::getline(_input_file, _line);) {
            if (is_frontmatter_tag(_line) && !_is_opening_tag_parse)
                _is_opening_tag_parse = true;
            else if (is_frontmatter_tag(_line) && _is_opening_tag_parse && !_is_closing_tag_parse)
                _is_closing_tag_parse = true;
            else if ((_is_opening_tag_parse && !_is_closing_tag_parse) || ((regex_match(_line, _whitespace) || _line.empty()) && !_content_start))
                continue;
            else {
                _output += _line + "\n";
                _content_start = true;
            }
        }

        _input_file.close();
        return _output;
    }